

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_unset_kv_int(kvtree *hash,char *key,int val)

{
  undefined4 in_register_00000014;
  char tmp [100];
  char acStack_88 [112];
  
  sprintf(acStack_88,"%d",CONCAT44(in_register_00000014,val));
  kvtree_unset_kv(hash,key,acStack_88);
  return 0;
}

Assistant:

int kvtree_unset_kv_int(kvtree* hash, const char* key, int val)
{
  /* TODO: this feels kludgy, but I guess as long as the ASCII string
   * is longer than a max int (or minimum int with leading minus sign)
   * which is 11 chars, we're ok ("-2147483648" to "2147483647") */
  char tmp[100];
  sprintf(tmp, "%d", val);
  return kvtree_unset_kv(hash, key, tmp);
}